

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

void __thiscall
cmDependsFortran::MatchRemoteModules(cmDependsFortran *this,istream *fin,string *stampDir)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  string_view sVar5;
  string local_c8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string local_78 [8];
  string mod;
  undefined1 local_40 [7];
  bool doing_provides;
  string line;
  string *stampDir_local;
  istream *fin_local;
  cmDependsFortran *this_local;
  
  line.field_2._8_8_ = stampDir;
  std::__cxx11::string::string((string *)local_40);
  bVar2 = false;
  while( true ) {
    bVar1 = cmsys::SystemTools::GetLineFromStream
                      (fin,(string *)local_40,(bool *)0x0,0xffffffffffffffff);
    if (!bVar1) break;
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      if (*pcVar4 != '#') {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
        if (*pcVar4 != '\r') {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
          if (*pcVar4 == ' ') {
            if (bVar2 != false) {
              std::__cxx11::string::string(local_78,(string *)local_40);
              sVar5 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view(local_78);
              local_88 = sVar5;
              bVar1 = cmHasLiteralSuffix<5ul>(sVar5,(char (*) [5])".mod");
              if (!bVar1) {
                sVar5 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view(local_78);
                local_98 = sVar5;
                bVar1 = cmHasLiteralSuffix<6ul>(sVar5,(char (*) [6])".smod");
                if (!bVar1) {
                  sVar5 = (string_view)
                          std::__cxx11::string::operator_cast_to_basic_string_view(local_78);
                  local_a8 = sVar5;
                  bVar1 = cmHasLiteralSuffix<5ul>(sVar5,(char (*) [5])".sub");
                  if (!bVar1) {
                    std::__cxx11::string::operator+=(local_78,".mod");
                  }
                }
              }
              std::__cxx11::string::substr((ulong)&local_c8,(ulong)local_78);
              ConsiderModule(this,&local_c8,(string *)line.field_2._8_8_);
              std::__cxx11::string::~string((string *)&local_c8);
              std::__cxx11::string::~string(local_78);
            }
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"provides");
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmDependsFortran::MatchRemoteModules(std::istream& fin,
                                          const std::string& stampDir)
{
  std::string line;
  bool doing_provides = false;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    // Ignore comments and empty lines.
    if (line.empty() || line[0] == '#' || line[0] == '\r') {
      continue;
    }

    if (line[0] == ' ') {
      if (doing_provides) {
        std::string mod = line;
        if (!cmHasLiteralSuffix(mod, ".mod") &&
            !cmHasLiteralSuffix(mod, ".smod") &&
            !cmHasLiteralSuffix(mod, ".sub")) {
          // Support fortran.internal files left by older versions of CMake.
          // They do not include the ".mod" extension.
          mod += ".mod";
        }
        this->ConsiderModule(mod.substr(1), stampDir);
      }
    } else if (line == "provides") {
      doing_provides = true;
    } else {
      doing_provides = false;
    }
  }
}